

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool __thiscall ClipperLib::Clipper::FixupIntersections(Clipper *this)

{
  bool local_41;
  TEdge *local_38;
  TEdge *e2;
  TEdge *e1;
  IntersectNode *int2;
  IntersectNode *int1;
  Clipper *this_local;
  
  if (this->m_IntersectNodes->next == (IntersectNode *)0x0) {
    this_local._7_1_ = true;
  }
  else {
    CopyAELToSEL(this);
    int2 = this->m_IntersectNodes;
    e1 = (TEdge *)this->m_IntersectNodes->next;
    while (e1 != (TEdge *)0x0) {
      e2 = int2->edge1;
      if (e2->prevInSEL == int2->edge2) {
        local_38 = e2->prevInSEL;
      }
      else if (e2->nextInSEL == int2->edge2) {
        local_38 = e2->nextInSEL;
      }
      else {
        for (; ((e1 != (TEdge *)0x0 && (*(long *)(e1->xbot + 0x80) != e1->ybot)) &&
               (*(long *)(e1->xbot + 0x88) != e1->ybot)); e1 = (TEdge *)e1->xtop) {
        }
        if (e1 == (TEdge *)0x0) {
          return false;
        }
        SwapIntersectNodes(int2,(IntersectNode *)e1);
        e2 = int2->edge1;
        local_38 = int2->edge2;
      }
      SwapPositionsInSEL(this,e2,local_38);
      int2 = int2->next;
      e1 = (TEdge *)int2->next;
    }
    this->m_SortedEdges = (TEdge *)0x0;
    local_41 = true;
    if (int2->edge1->prevInSEL != int2->edge2) {
      local_41 = int2->edge1->nextInSEL == int2->edge2;
    }
    this_local._7_1_ = local_41;
  }
  return this_local._7_1_;
}

Assistant:

bool Clipper::FixupIntersections()
{
  if ( !m_IntersectNodes->next ) return true;

  CopyAELToSEL();
  IntersectNode *int1 = m_IntersectNodes;
  IntersectNode *int2 = m_IntersectNodes->next;
  while (int2)
  {
    TEdge *e1 = int1->edge1;
    TEdge *e2;
    if (e1->prevInSEL == int1->edge2) e2 = e1->prevInSEL;
    else if (e1->nextInSEL == int1->edge2) e2 = e1->nextInSEL;
    else
    {
      //The current intersection is out of order, so try and swap it with
      //a subsequent intersection ...
      while (int2)
      {
        if (int2->edge1->nextInSEL == int2->edge2 ||
          int2->edge1->prevInSEL == int2->edge2) break;
        else int2 = int2->next;
      }
      if ( !int2 ) return false; //oops!!!

      //found an intersect node that can be swapped ...
      SwapIntersectNodes(*int1, *int2);
      e1 = int1->edge1;
      e2 = int1->edge2;
    }
    SwapPositionsInSEL(e1, e2);
    int1 = int1->next;
    int2 = int1->next;
  }

  m_SortedEdges = 0;

  //finally, check the last intersection too ...
  return (int1->edge1->prevInSEL == int1->edge2 ||
    int1->edge1->nextInSEL == int1->edge2);
}